

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

StorageClass __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::TranslateStorageClass
          (TGlslangToSpvTraverser *this,TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  EShSource EVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar2 = (*type->_vptr_TType[7])();
  if ((iVar2 == 0x13) || (iVar2 = (*type->_vptr_TType[7])(), iVar2 == 0x14)) {
    return Private;
  }
  iVar2 = (*type->_vptr_TType[0xb])();
  bVar1 = glslang::TQualifier::isSpirvByReference((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    iVar2 = (*type->_vptr_TType[0xb])();
    bVar1 = glslang::TQualifier::isParamInput((TQualifier *)CONCAT44(extraout_var_00,iVar2));
    if (!bVar1) {
      iVar2 = (*type->_vptr_TType[0xb])();
      bVar1 = glslang::TQualifier::isParamOutput((TQualifier *)CONCAT44(extraout_var_01,iVar2));
      if (!bVar1) goto LAB_00692c26;
    }
    this_local._4_4_ = Function;
  }
  else {
LAB_00692c26:
    iVar2 = (*type->_vptr_TType[0xb])();
    bVar1 = glslang::TQualifier::isPipeInput((TQualifier *)CONCAT44(extraout_var_02,iVar2));
    if (bVar1) {
      this_local._4_4_ = Input;
    }
    else {
      iVar2 = (*type->_vptr_TType[0xb])();
      bVar1 = glslang::TQualifier::isPipeOutput((TQualifier *)CONCAT44(extraout_var_03,iVar2));
      if (bVar1) {
        this_local._4_4_ = Output;
      }
      else {
        iVar2 = (*type->_vptr_TType[0xb])();
        if ((((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f) == 0x1f) ||
           (uVar3 = (*type->_vptr_TType[0x2a])(), (uVar3 & 1) != 0)) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
          spv::Builder::addCapability(&this->builder,CapabilityTileImageColorReadAccessEXT);
          this_local._4_4_ = StorageClassTileImageEXT;
        }
        else {
          EVar4 = glslang::TIntermediate::getSource(this->glslangIntermediate);
          if ((EVar4 != EShSourceHlsl) ||
             (iVar2 = (*type->_vptr_TType[0xb])(),
             ((uint)*(undefined8 *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x7f) == 5)) {
            bVar1 = glslang::TType::isAtomic(type);
            if (bVar1) {
              return AtomicCounter;
            }
            uVar3 = (*type->_vptr_TType[0x36])();
            if (((uVar3 & 1) != 0) &&
               (bVar1 = glslang::TIntermediate::getBindlessMode(this->glslangIntermediate), !bVar1))
            {
              return StorageClassUniformConstant;
            }
          }
          iVar2 = (*type->_vptr_TType[0xb])();
          bVar1 = glslang::TQualifier::isUniformOrBuffer
                            ((TQualifier *)CONCAT44(extraout_var_06,iVar2));
          if (bVar1) {
            iVar2 = (*type->_vptr_TType[0xb])();
            bVar1 = glslang::TQualifier::isShaderRecord
                              ((TQualifier *)CONCAT44(extraout_var_07,iVar2));
            if (bVar1) {
              return ShaderRecordBufferKHR;
            }
          }
          bVar1 = glslang::TIntermediate::usingStorageBuffer(this->glslangIntermediate);
          if ((bVar1) &&
             (iVar2 = (*type->_vptr_TType[0xb])(),
             ((uint)*(undefined8 *)(CONCAT44(extraout_var_08,iVar2) + 8) & 0x7f) == 6)) {
            spv::Builder::addIncorporatedExtension
                      (&this->builder,"SPV_KHR_storage_buffer_storage_class",Spv_1_3);
            this_local._4_4_ = StorageBuffer;
          }
          else {
            iVar2 = (*type->_vptr_TType[0xb])();
            bVar1 = glslang::TQualifier::isUniformOrBuffer
                              ((TQualifier *)CONCAT44(extraout_var_09,iVar2));
            if (bVar1) {
              iVar2 = (*type->_vptr_TType[0xb])();
              bVar1 = glslang::TQualifier::isPushConstant
                                ((TQualifier *)CONCAT44(extraout_var_10,iVar2));
              if (bVar1) {
                this_local._4_4_ = PushConstant;
              }
              else {
                iVar2 = (*type->_vptr_TType[7])();
                if (iVar2 == 0x10) {
                  this_local._4_4_ = StorageClassUniform;
                }
                else {
                  this_local._4_4_ = StorageClassUniformConstant;
                }
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xb])();
              if ((((uint)*(undefined8 *)(CONCAT44(extraout_var_11,iVar2) + 8) & 0x7f) == 7) &&
                 (iVar2 = (*type->_vptr_TType[7])(), iVar2 == 0x10)) {
                spv::Builder::addExtension
                          (&this->builder,"SPV_KHR_workgroup_memory_explicit_layout");
                spv::Builder::addCapability
                          (&this->builder,CapabilityWorkgroupMemoryExplicitLayoutKHR);
                this_local._4_4_ = StorageClassWorkgroup;
              }
              else {
                iVar2 = (*type->_vptr_TType[0xb])();
                switch((uint)*(undefined8 *)(CONCAT44(extraout_var_12,iVar2) + 8) & 0x7f) {
                case 0:
                  this_local._4_4_ = Function;
                  break;
                case 1:
                  this_local._4_4_ = Private;
                  break;
                default:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                                ,0x55f,
                                "spv::StorageClass (anonymous namespace)::TGlslangToSpvTraverser::TranslateStorageClass(const glslang::TType &)"
                               );
                case 7:
                  this_local._4_4_ = StorageClassWorkgroup;
                  break;
                case 8:
                  iVar2 = (*type->_vptr_TType[0xb])();
                  this_local._4_4_ = *(StorageClass *)(CONCAT44(extraout_var_13,iVar2) + 0x3c);
                  break;
                case 9:
                  this_local._4_4_ = RayPayloadKHR;
                  break;
                case 10:
                  this_local._4_4_ = IncomingRayPayloadKHR;
                  break;
                case 0xb:
                  this_local._4_4_ = HitAttributeKHR;
                  break;
                case 0xc:
                  this_local._4_4_ = CallableDataKHR;
                  break;
                case 0xd:
                  this_local._4_4_ = IncomingCallableDataKHR;
                  break;
                case 0xe:
                  this_local._4_4_ = HitObjectAttributeNV;
                  break;
                case 0xf:
                  this_local._4_4_ = StorageClassTaskPayloadWorkgroupEXT;
                  break;
                case 0x13:
                  this_local._4_4_ = Function;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

spv::StorageClass TGlslangToSpvTraverser::TranslateStorageClass(const glslang::TType& type)
{
    if (type.getBasicType() == glslang::EbtRayQuery || type.getBasicType() == glslang::EbtHitObjectNV)
        return spv::StorageClassPrivate;
    if (type.getQualifier().isSpirvByReference()) {
        if (type.getQualifier().isParamInput() || type.getQualifier().isParamOutput())
            return spv::StorageClassFunction;
    }
    if (type.getQualifier().isPipeInput())
        return spv::StorageClassInput;
    if (type.getQualifier().isPipeOutput())
        return spv::StorageClassOutput;
    if (type.getQualifier().storage == glslang::EvqTileImageEXT || type.isAttachmentEXT()) {
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageColorReadAccessEXT);
        return spv::StorageClassTileImageEXT;
    }

    if (glslangIntermediate->getSource() != glslang::EShSourceHlsl ||
            type.getQualifier().storage == glslang::EvqUniform) {
        if (type.isAtomic())
            return spv::StorageClassAtomicCounter;
        if (type.containsOpaque() && !glslangIntermediate->getBindlessMode())
            return spv::StorageClassUniformConstant;
    }

    if (type.getQualifier().isUniformOrBuffer() &&
        type.getQualifier().isShaderRecord()) {
        return spv::StorageClassShaderRecordBufferKHR;
    }

    if (glslangIntermediate->usingStorageBuffer() && type.getQualifier().storage == glslang::EvqBuffer) {
        builder.addIncorporatedExtension(spv::E_SPV_KHR_storage_buffer_storage_class, spv::Spv_1_3);
        return spv::StorageClassStorageBuffer;
    }

    if (type.getQualifier().isUniformOrBuffer()) {
        if (type.getQualifier().isPushConstant())
            return spv::StorageClassPushConstant;
        if (type.getBasicType() == glslang::EbtBlock)
            return spv::StorageClassUniform;
        return spv::StorageClassUniformConstant;
    }

    if (type.getQualifier().storage == glslang::EvqShared && type.getBasicType() == glslang::EbtBlock) {
        builder.addExtension(spv::E_SPV_KHR_workgroup_memory_explicit_layout);
        builder.addCapability(spv::CapabilityWorkgroupMemoryExplicitLayoutKHR);
        return spv::StorageClassWorkgroup;
    }

    switch (type.getQualifier().storage) {
    case glslang::EvqGlobal:        return spv::StorageClassPrivate;
    case glslang::EvqConstReadOnly: return spv::StorageClassFunction;
    case glslang::EvqTemporary:     return spv::StorageClassFunction;
    case glslang::EvqShared:           return spv::StorageClassWorkgroup;
    case glslang::EvqPayload:        return spv::StorageClassRayPayloadKHR;
    case glslang::EvqPayloadIn:      return spv::StorageClassIncomingRayPayloadKHR;
    case glslang::EvqHitAttr:        return spv::StorageClassHitAttributeKHR;
    case glslang::EvqCallableData:   return spv::StorageClassCallableDataKHR;
    case glslang::EvqCallableDataIn: return spv::StorageClassIncomingCallableDataKHR;
    case glslang::EvqtaskPayloadSharedEXT : return spv::StorageClassTaskPayloadWorkgroupEXT;
    case glslang::EvqHitObjectAttrNV: return spv::StorageClassHitObjectAttributeNV;
    case glslang::EvqSpirvStorageClass: return static_cast<spv::StorageClass>(type.getQualifier().spirvStorageClass);
    default:
        assert(0);
        break;
    }

    return spv::StorageClassFunction;
}